

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

bool llvm::ARM::getExtensionFeatures
               (uint Extensions,vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features)

{
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *pvVar1;
  value_type local_118;
  value_type local_108;
  value_type local_f8;
  value_type local_e8;
  value_type local_d8;
  value_type local_c8;
  value_type local_b8;
  value_type local_a8;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *local_98;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features_local;
  uint Extensions_local;
  value_type *local_80;
  char *local_78;
  value_type *local_70;
  char *local_68;
  value_type *local_60;
  char *local_58;
  value_type *local_50;
  char *local_48;
  value_type *local_40;
  char *local_38;
  value_type *local_30;
  char *local_28;
  value_type *local_20;
  char *local_18;
  value_type *local_10;
  
  if (Extensions == 0) {
    Features_local._7_1_ = false;
  }
  else {
    local_98 = Features;
    Features_local._0_4_ = Extensions;
    if ((Extensions & 2) == 0) {
      local_70 = &local_b8;
      local_78 = "-crc";
      local_b8.Data = "-crc";
      local_b8.Length = strlen("-crc");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(Features,&local_b8);
    }
    else {
      local_80 = &local_a8;
      _Extensions_local = "+crc";
      local_a8.Data = "+crc";
      local_a8.Length = strlen("+crc");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(Features,&local_a8);
    }
    pvVar1 = local_98;
    if (((uint)Features_local & 0x400) == 0) {
      local_50 = &local_d8;
      local_58 = "-dsp";
      local_d8.Data = "-dsp";
      local_d8.Length = strlen("-dsp");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_d8);
    }
    else {
      local_60 = &local_c8;
      local_68 = "+dsp";
      local_c8.Data = "+dsp";
      local_c8.Length = strlen("+dsp");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_c8);
    }
    pvVar1 = local_98;
    if (((uint)Features_local & 0x1000) == 0) {
      local_30 = &local_f8;
      local_38 = "-ras";
      local_f8.Data = "-ras";
      local_f8.Length = strlen("-ras");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_f8);
    }
    else {
      local_40 = &local_e8;
      local_48 = "+ras";
      local_e8.Data = "+ras";
      local_e8.Length = strlen("+ras");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_e8);
    }
    pvVar1 = local_98;
    if (((uint)Features_local & 0x4000) == 0) {
      local_10 = &local_118;
      local_18 = "-dotprod";
      local_118.Data = "-dotprod";
      local_118.Length = strlen("-dotprod");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_118);
    }
    else {
      local_20 = &local_108;
      local_28 = "+dotprod";
      local_108.Data = "+dotprod";
      local_108.Length = strlen("+dotprod");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(pvVar1,&local_108);
    }
    Features_local._7_1_ = getHWDivFeatures((uint)Features_local,local_98);
  }
  return Features_local._7_1_;
}

Assistant:

bool llvm::ARM::getExtensionFeatures(unsigned Extensions,
                                     std::vector<StringRef> &Features) {

  if (Extensions == ARM::AEK_INVALID)
    return false;

  if (Extensions & ARM::AEK_CRC)
    Features.push_back("+crc");
  else
    Features.push_back("-crc");

  if (Extensions & ARM::AEK_DSP)
    Features.push_back("+dsp");
  else
    Features.push_back("-dsp");

  if (Extensions & ARM::AEK_RAS)
    Features.push_back("+ras");
  else
    Features.push_back("-ras");

  if (Extensions & ARM::AEK_DOTPROD)
    Features.push_back("+dotprod");
  else
    Features.push_back("-dotprod");

  return getHWDivFeatures(Extensions, Features);
}